

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,Type type)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SPxOut *pSVar3;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  char cVar5;
  bool bVar6;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  uint *puVar13;
  uint *puVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  byte bVar18;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  Verbosity old_verbosity;
  shared_ptr<soplex::Tolerances> local_1c8;
  undefined1 local_1b8 [24];
  undefined8 uStack_1a0;
  pointer local_198;
  pointer pnStack_190;
  pointer local_188;
  undefined8 uStack_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  uint local_168 [7];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar18 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = &pSVar2->weights;
  this_01 = &pSVar2->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      iVar16 = 0;
      iVar9 = 0;
      if (pSVar2->weightsAreSetup != false) {
        iVar9 = (pSVar2->thecovectors->set).thenum;
        iVar16 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pSVar2->coWeights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (iVar9 < iVar16) {
          iVar16 = iVar9;
        }
        iVar1 = (pSVar2->thevectors->set).thenum;
        iVar9 = (int)((ulong)((long)(pSVar2->weights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar2->weights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (iVar1 < iVar9) {
          iVar9 = iVar1;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_01->val,(long)(pSVar2->thecovectors->set).thenum);
      iVar1 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->thecovectors->set).thenum;
      lVar17 = (long)iVar1;
      if (iVar16 < iVar1) {
        lVar10 = lVar17 << 7;
        do {
          lVar17 = lVar17 + -1;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)(this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar10),2.0);
          lVar10 = lVar10 + -0x80;
        } while (iVar16 < lVar17);
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_00->val,
               (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thevectors->set).thenum);
      iVar16 = (((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->thevectors->set).thenum;
      lVar17 = (long)iVar16;
      if (iVar9 < iVar16) {
        lVar10 = lVar17 << 7;
        do {
          lVar17 = lVar17 + -1;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)(this_00->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar10),1.0);
          lVar10 = lVar10 + -0x80;
        } while (iVar9 < lVar17);
      }
    }
    else {
      iVar9 = 0;
      if (pSVar2->weightsAreSetup != false) {
        iVar16 = (pSVar2->thecovectors->set).thenum;
        iVar9 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar2->coWeights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (iVar16 < iVar9) {
          iVar9 = iVar16;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_01->val,(long)(pSVar2->thecovectors->set).thenum);
      iVar16 = (((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->thecovectors->set).thenum;
      lVar17 = (long)iVar16;
      if (iVar9 < iVar16) {
        lVar10 = lVar17 << 7;
        do {
          lVar17 = lVar17 + -1;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)(this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar10),1.0);
          lVar10 = lVar10 + -0x80;
        } while (iVar9 < lVar17);
      }
    }
  }
  else {
    pSVar3 = pSVar2->spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (2 < (int)pSVar3->m_verbosity)) {
      local_138.data._M_elems[0] = pSVar3->m_verbosity;
      local_1b8._0_4_ = 3;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],
                 " --- initializing steepest edge multipliers",0x2b);
      cVar5 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pSVar3 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_138);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::resize(&this_01->val,
             (long)(((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->thecovectors->set).thenum);
    if (type == ENTER) {
      lVar17 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      if (0 < lVar17) {
        lVar10 = lVar17 + 1;
        lVar17 = lVar17 << 7;
        do {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)(this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar17),1.0);
          lVar10 = lVar10 + -1;
          lVar17 = lVar17 + -0x80;
        } while (1 < lVar10);
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_00->val,
               (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thevectors->set).thenum);
      lVar17 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thevectors->set).thenum;
      if (0 < lVar17) {
        lVar10 = lVar17 + 1;
        lVar17 = lVar17 * 0x10 + -1;
        do {
          pSVar4 = ((this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->thevectors;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length2(&local_b0,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((pSVar4->set).theitem + (pSVar4->set).thekey[lVar10 + -2].idx));
          local_140._0_4_ = cpp_dec_float_finite;
          local_140._4_4_ = 0x1c;
          local_1b8._0_8_ = (_func_int **)0x0;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1b8._16_8_ = (int *)0x0;
          uStack_1a0._0_1_ = false;
          uStack_1a0._1_7_ = 0;
          local_198 = (pointer)0x0;
          pnStack_190 = (pointer)0x0;
          local_188 = (pointer)0x0;
          uStack_180._0_1_ = false;
          uStack_180._1_7_ = 0;
          local_178 = (element_type *)0x0;
          _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_168[0] = 0;
          local_168[1] = 0;
          local_168[2] = 0;
          local_168[3] = 0;
          local_168[4] = 0;
          local_168[5] = 0;
          stack0xfffffffffffffeb0 = 0;
          uStack_14b = 0;
          iStack_148 = 0;
          bStack_144 = false;
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 0x1c;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems[6] = 0;
          local_138.data._M_elems[7] = 0;
          local_138.data._M_elems[8] = 0;
          local_138.data._M_elems[9] = 0;
          local_138.data._M_elems[10] = 0;
          local_138.data._M_elems[0xb] = 0;
          local_138.data._M_elems[0xc] = 0;
          local_138.data._M_elems[0xd] = 0;
          local_138.data._M_elems[0xe] = 0;
          local_138.data._M_elems[0xf] = 0;
          local_138.data._M_elems[0x10] = 0;
          local_138.data._M_elems[0x11] = 0;
          local_138.data._M_elems[0x12] = 0;
          local_138.data._M_elems[0x13] = 0;
          local_138.data._M_elems[0x14] = 0;
          local_138.data._M_elems[0x15] = 0;
          local_138.data._M_elems[0x16] = 0;
          local_138.data._M_elems[0x17] = 0;
          local_138.data._M_elems[0x18] = 0;
          local_138.data._M_elems[0x19] = 0;
          local_138.data._M_elems._104_5_ = 0;
          local_138.data._M_elems[0x1b]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_138,1.0);
          pnVar11 = &local_b0;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          }
          iStack_148 = local_b0.m_backend.exp;
          bStack_144 = local_b0.m_backend.neg;
          local_140._0_4_ = local_b0.m_backend.fpclass;
          local_140._4_4_ = local_b0.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_1b8,&local_138);
          puVar14 = (((this_00->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar17 * 2;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
          puVar13 = puVar14 + 0xffffffffffffffe2;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar13 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
            puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
          }
          puVar14[0xfffffffffffffffe] = iStack_148;
          *(bool *)(puVar14 + 0xffffffffffffffff) = bStack_144;
          puVar14[0] = (fpclass_type)local_140;
          puVar14[1] = local_140._4_4_;
          lVar10 = lVar10 + -1;
          lVar17 = lVar17 + -0x10;
        } while (1 < lVar10);
      }
    }
    else {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar9 = (pSVar2->thecovectors->set).thenum;
      local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pSVar2->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (pSVar2->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_1b8,iVar9,&local_1c8);
      if (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      lVar17 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      if (0 < lVar17) {
        lVar10 = lVar17 + 1;
        lVar15 = lVar17 * 0x80 + -8;
        lVar17 = lVar17 * 0x98;
        do {
          bVar6 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isTimeLimitReached
                            ((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,false);
          if (bVar6) break;
          pSVar2 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(&pSVar2->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_1b8,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)(pSVar2->unitVecs).data.
                              super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].themem.val.m_backend.
                              data._M_elems + lVar17 + -0x10));
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length2((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_138,
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_1b8);
          puVar7 = (undefined8 *)
                   ((long)(((this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar15);
          pcVar12 = &local_138;
          puVar14 = (uint *)(puVar7 + -0xf);
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar14 = (((cpp_dec_float<200U,_int,_void> *)&pcVar12->data)->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar18 * -2 + 1) * 4);
            puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
          }
          *(int *)(puVar7 + -1) = local_138.exp;
          *(bool *)((long)puVar7 + -4) = local_138.neg;
          *puVar7 = local_138._120_8_;
          lVar10 = lVar10 + -1;
          lVar15 = lVar15 + -0x80;
          lVar17 = lVar17 + -0x98;
        } while (1 < lVar10);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_1b8);
    }
  }
  ((this->
   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thesolver)->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}